

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void opj_mqc_init_dec(opj_mqc_t *mqc,OPJ_BYTE *bp,OPJ_UINT32 len,OPJ_UINT32 extra_writable_bytes)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  
  opj_mqc_init_dec_common(mqc,bp,len,extra_writable_bytes);
  mqc->curctx = mqc->ctxs;
  mqc->end_of_byte_stream_counter = 0;
  pbVar2 = mqc->bp;
  if (len == 0) {
    uVar3 = 0xff0000;
  }
  else {
    uVar3 = (uint)*pbVar2 << 0x10;
  }
  mqc->c = uVar3;
  bVar1 = pbVar2[1];
  if (*pbVar2 == 0xff) {
    if (bVar1 < 0x90) {
      mqc->bp = pbVar2 + 1;
      uVar3 = uVar3 + (uint)bVar1 * 0x200;
      OVar4 = 0;
      goto LAB_00121184;
    }
    uVar3 = uVar3 | 0xff00;
    mqc->end_of_byte_stream_counter = 1;
  }
  else {
    mqc->bp = pbVar2 + 1;
    uVar3 = uVar3 | (uint)bVar1 << 8;
  }
  OVar4 = 1;
LAB_00121184:
  mqc->c = uVar3 << 7;
  mqc->ct = OVar4;
  mqc->a = 0x8000;
  return;
}

Assistant:

void opj_mqc_init_dec(opj_mqc_t *mqc, OPJ_BYTE *bp, OPJ_UINT32 len,
                      OPJ_UINT32 extra_writable_bytes)
{
    /* Implements ISO 15444-1 C.3.5 Initialization of the decoder (INITDEC) */
    /* Note: alternate "J.1 - Initialization of the software-conventions */
    /* decoder" has been tried, but does */
    /* not bring any improvement. */
    /* See https://github.com/uclouvain/openjpeg/issues/921 */
    opj_mqc_init_dec_common(mqc, bp, len, extra_writable_bytes);
    opj_mqc_setcurctx(mqc, 0);
    mqc->end_of_byte_stream_counter = 0;
    if (len == 0) {
        mqc->c = 0xff << 16;
    } else {
        mqc->c = (OPJ_UINT32)(*mqc->bp << 16);
    }

    opj_mqc_bytein(mqc);
    mqc->c <<= 7;
    mqc->ct -= 7;
    mqc->a = 0x8000;
}